

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O0

bool __thiscall
jsonrpccxx::JsonRpcServer::Add
          (JsonRpcServer *this,string *name,NotificationHandle *callback,NamedParamMapping *mapping)

{
  NotificationHandle *name_00;
  long lVar1;
  function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_50;
  NamedParamMapping *local_30;
  NamedParamMapping *mapping_local;
  NotificationHandle *callback_local;
  string *name_local;
  JsonRpcServer *this_local;
  
  local_30 = mapping;
  mapping_local = (NamedParamMapping *)callback;
  callback_local = (NotificationHandle *)name;
  name_local = (string *)this;
  lVar1 = std::__cxx11::string::rfind((char *)name,0x1f3d14);
  name_00 = callback_local;
  if (lVar1 == 0) {
    this_local._7_1_ = 0;
  }
  else {
    std::
    function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
    ::function(&local_50,callback);
    this_local._7_1_ = Dispatcher::Add(&this->dispatcher,(string *)name_00,&local_50,local_30);
    std::
    function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
    ::~function(&local_50);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Add(const std::string &name, NotificationHandle callback, const NamedParamMapping &mapping = NAMED_PARAM_MAPPING) {
      if (name.rfind("rpc.", 0) == 0)
        return false;
      return dispatcher.Add(name, callback, mapping);
    }